

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O1

void __thiscall
llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::clear
          (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this)

{
  StringMapEntryBase **ppSVar1;
  StringMapEntryBase *__ptr;
  ulong uVar2;
  ulong uVar3;
  
  if ((this->super_StringMapImpl).NumItems != 0) {
    uVar2 = (ulong)(this->super_StringMapImpl).NumBuckets;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        ppSVar1 = (this->super_StringMapImpl).TheTable;
        __ptr = ppSVar1[uVar3];
        if ((__ptr != (StringMapEntryBase *)0xfffffffffffffff8) &&
           (__ptr != (StringMapEntryBase *)0x0)) {
          free(__ptr);
        }
        ppSVar1[uVar3] = (StringMapEntryBase *)0x0;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    (this->super_StringMapImpl).NumItems = 0;
    (this->super_StringMapImpl).NumTombstones = 0;
  }
  return;
}

Assistant:

bool empty() const { return NumItems == 0; }